

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context local_110;
  
  __off = ftell((FILE *)f);
  local_110.img_buffer = local_110.buffer_start;
  local_110.io.eof = stbi__stdio_eof;
  local_110.io.read = stbi__stdio_read;
  local_110.io.skip = stbi__stdio_skip;
  local_110.read_from_callbacks = 1;
  local_110.buflen = 0x80;
  local_110.callback_already_read = 0;
  local_110.io_user_data = f;
  local_110.img_buffer_original = local_110.img_buffer;
  stbi__refill_buffer(&local_110);
  local_110.img_buffer_original_end = local_110.img_buffer_end;
  iVar1 = stbi__info_main(&local_110,x,y,comp);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}